

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void nn(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *args)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  istream *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  undefined1 auVar4 [16];
  string queryWord;
  string prompt;
  FastText fasttext;
  int32_t k;
  size_t *in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  undefined4 uVar5;
  int iVar6;
  undefined4 in_stack_fffffffffffffb7c;
  allocator *paVar7;
  FastText *in_stack_fffffffffffffba0;
  ulong local_338;
  undefined1 in_stack_fffffffffffffcf7;
  int in_stack_fffffffffffffcf8;
  int32_t in_stack_fffffffffffffcfc;
  string *in_stack_fffffffffffffd00;
  FastText *in_stack_fffffffffffffd08;
  string *in_stack_fffffffffffffdf8;
  FastText *in_stack_fffffffffffffe00;
  undefined4 local_1a0;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [48];
  string local_b8 [172];
  int local_c;
  
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  if (sVar2 == 3) {
    local_c = 10;
  }
  else {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RDI);
    if (sVar2 != 4) {
      printNNUsage();
      exit(1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](in_RDI,3);
    local_c = std::__cxx11::stoi((string *)
                                 CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                                 in_stack_fffffffffffffb68,0);
  }
  ::fasttext::FastText::FastText(in_stack_fffffffffffffba0);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](in_RDI,2);
  std::__cxx11::string::string(local_b8,(string *)pvVar3);
  ::fasttext::FastText::loadModel(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  std::__cxx11::string::~string(local_b8);
  paVar7 = &local_e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"Query word? ",paVar7);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::operator<<((ostream *)&std::cout,local_e8);
  std::__cxx11::string::string(local_110);
  while( true ) {
    this = std::operator>>((istream *)&std::cin,local_110);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(this + *(long *)(*(long *)this + -0x18)));
    in_stack_fffffffffffffb7c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb7c);
    if (!bVar1) break;
    iVar6 = local_c;
    ::fasttext::FastText::getArgs((FastText *)CONCAT44(in_stack_fffffffffffffb7c,local_c));
    uVar5 = local_1a0;
    ::fasttext::FastText::getArgs((FastText *)CONCAT44(in_stack_fffffffffffffb7c,iVar6));
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_338;
    vcmpsd_avx512f((undefined1  [16])0x0,auVar4,4);
    ::fasttext::FastText::getNNMod
              (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
               in_stack_fffffffffffffcf8,(bool)in_stack_fffffffffffffcf7);
    printPredictions((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_RDI,SUB81((ulong)paVar7 >> 0x38,0),SUB81((ulong)paVar7 >> 0x30,0));
    std::
    vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)this);
    ::fasttext::Args::~Args((Args *)CONCAT44(uVar5,in_stack_fffffffffffffb70));
    ::fasttext::Args::~Args((Args *)CONCAT44(uVar5,in_stack_fffffffffffffb70));
    std::operator<<((ostream *)&std::cout,local_e8);
  }
  exit(0);
}

Assistant:

void nn(const std::vector<std::string> args) {
  int32_t k;
  if (args.size() == 3) {
    k = 10;
  } else if (args.size() == 4) {
    k = std::stoi(args[3]);
  } else {
    printNNUsage();
    exit(EXIT_FAILURE);
  }
  FastText fasttext;
  fasttext.loadModel(std::string(args[2]));
  std::string prompt("Query word? ");
  std::cout << prompt;
  std::string queryWord;
  while (std::cin >> queryWord) {
//    std::cout << queryWord;
    printPredictions(fasttext.getNNMod(queryWord, k, fasttext.getArgs().factor, fasttext.getArgs().addWo), true, true);
    std::cout << prompt;
  }
  exit(0);
}